

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.h
# Opt level: O2

Version * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_internal_mutable_compiler_version
          (CodeGeneratorRequest *this)

{
  Version *pVVar1;
  Arena *arena;
  
  pVVar1 = (this->field_0)._impl_.compiler_version_;
  if (pVVar1 != (Version *)0x0) {
    return pVVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pVVar1 = (Version *)Arena::DefaultConstruct<google::protobuf::compiler::Version>(arena);
  (this->field_0)._impl_.compiler_version_ = pVVar1;
  return pVVar1;
}

Assistant:

inline ::google::protobuf::compiler::Version* PROTOBUF_NONNULL CodeGeneratorRequest::_internal_mutable_compiler_version() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.compiler_version_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::compiler::Version>(GetArena());
    _impl_.compiler_version_ = reinterpret_cast<::google::protobuf::compiler::Version*>(p);
  }
  return _impl_.compiler_version_;
}